

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  int *piVar1;
  long *plVar2;
  int iVar3;
  tm *ptVar4;
  long *plVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  long lVar8;
  ulong *puVar9;
  TimeInMillis ms;
  bool bVar10;
  ulong uVar11;
  undefined8 uVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  string local_2f8;
  int local_2d4;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined8 uStack_178;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  long *local_130;
  undefined8 local_128;
  long local_120;
  undefined8 uStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  undefined1 local_d0 [8];
  string kTestsuites;
  string kIndent;
  long local_80;
  undefined8 uStack_78;
  undefined1 local_70 [8];
  tm time_struct;
  
  local_d0 = (undefined1  [8])&kTestsuites._M_string_length;
  time_struct.tm_zone = (char *)unit_test;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"testsuites","");
  kTestsuites.field_2._8_8_ = &kIndent._M_string_length;
  std::__cxx11::string::_M_construct((ulong)((long)&kTestsuites.field_2 + 8),'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  piVar1 = &time_struct.tm_hour;
  local_70 = (undefined1  [8])piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"tests","");
  iVar3 = UnitTestImpl::reportable_test_count(*(UnitTestImpl **)(time_struct.tm_zone + 0x40));
  OutputJsonKey(stream,(string *)local_d0,(string *)local_70,iVar3,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if (local_70 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_70,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  local_70 = (undefined1  [8])piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"failures","");
  iVar3 = UnitTestImpl::failed_test_count(*(UnitTestImpl **)(time_struct.tm_zone + 0x40));
  OutputJsonKey(stream,(string *)local_d0,(string *)local_70,iVar3,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if (local_70 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_70,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  local_70 = (undefined1  [8])piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"disabled","");
  iVar3 = UnitTestImpl::reportable_disabled_test_count
                    (*(UnitTestImpl **)(time_struct.tm_zone + 0x40));
  OutputJsonKey(stream,(string *)local_d0,(string *)local_70,iVar3,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if (local_70 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_70,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  local_70 = (undefined1  [8])piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"errors","");
  OutputJsonKey(stream,(string *)local_d0,(string *)local_70,0,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if (local_70 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_70,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    local_70 = (undefined1  [8])piVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"random_seed","");
    OutputJsonKey(stream,(string *)local_d0,(string *)local_70,
                  *(int *)(*(long *)(time_struct.tm_zone + 0x40) + 0x1b4),
                  (string *)((long)&kTestsuites.field_2 + 8),true);
    if (local_70 != (undefined1  [8])piVar1) {
      operator_delete((void *)local_70,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
    }
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"timestamp","");
  kIndent.field_2._8_8_ = *(long *)(*(long *)(time_struct.tm_zone + 0x40) + 0x1c0) / 1000;
  ptVar4 = localtime_r((time_t *)(kIndent.field_2._M_local_buf + 8),(tm *)local_70);
  if (ptVar4 == (tm *)0x0) {
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    local_210._M_string_length = 0;
    local_210.field_2._M_allocated_capacity =
         local_210.field_2._M_allocated_capacity & 0xffffffffffffff00;
    goto LAB_0011fcfa;
  }
  local_2d4 = time_struct.tm_mday + 0x76c;
  StreamableToString<int>(&local_2f8,&local_2d4);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_1a0 = *puVar9;
    lStack_198 = plVar5[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar9;
    local_1b0 = (ulong *)*plVar5;
  }
  local_1a8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_2b0,(String *)(ulong)(time_struct.tm_hour + 1),(int)local_1a8);
  uVar11 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar11 = local_1a0;
  }
  if (uVar11 < local_2b0._M_string_length + local_1a8) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      uVar12 = local_2b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_2b0._M_string_length + local_1a8) goto LAB_0011f57a;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_0011f57a:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_2b0._M_dataplus._M_p);
  }
  local_130 = &local_120;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_120 = *plVar5;
    uStack_118 = puVar6[3];
  }
  else {
    local_120 = *plVar5;
    local_130 = (long *)*puVar6;
  }
  local_128 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_e0 = *puVar9;
    lStack_d8 = plVar5[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar9;
    local_f0 = (ulong *)*plVar5;
  }
  local_e8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_290,(String *)(ulong)(uint)time_struct.tm_min,(int)local_e8);
  uVar11 = 0xf;
  if (local_f0 != &local_e0) {
    uVar11 = local_e0;
  }
  if (uVar11 < local_290._M_string_length + local_e8) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      uVar12 = local_290.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_290._M_string_length + local_e8) goto LAB_0011f6ab;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_0011f6ab:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_290._M_dataplus._M_p);
  }
  local_150 = &local_140;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_140 = *plVar5;
    uStack_138 = puVar6[3];
  }
  else {
    local_140 = *plVar5;
    local_150 = (long *)*puVar6;
  }
  local_148 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_100 = *puVar9;
    lStack_f8 = plVar5[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar9;
    local_110 = (ulong *)*plVar5;
  }
  local_108 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_270,(String *)(ulong)(uint)time_struct.tm_sec,(int)local_108);
  uVar11 = 0xf;
  if (local_110 != &local_100) {
    uVar11 = local_100;
  }
  if (uVar11 < local_270._M_string_length + local_108) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar12 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_270._M_string_length + local_108) goto LAB_0011f7dc;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0011f7dc:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_270._M_dataplus._M_p);
  }
  local_170 = &local_160;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_160 = *plVar5;
    uStack_158 = puVar6[3];
  }
  else {
    local_160 = *plVar5;
    local_170 = (long *)*puVar6;
  }
  local_168 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_1c0 = *puVar9;
    lStack_1b8 = plVar5[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *puVar9;
    local_1d0 = (ulong *)*plVar5;
  }
  local_1c8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_(&local_250,(String *)((ulong)local_70 >> 0x20),(int)local_1c8);
  uVar11 = 0xf;
  if (local_1d0 != &local_1c0) {
    uVar11 = local_1c0;
  }
  if (uVar11 < local_250._M_string_length + local_1c8) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar12 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_250._M_string_length + local_1c8) goto LAB_0011f90f;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_1d0);
  }
  else {
LAB_0011f90f:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_250._M_dataplus._M_p);
  }
  local_190 = &local_180;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_180 = *plVar5;
    uStack_178 = puVar6[3];
  }
  else {
    local_180 = *plVar5;
    local_190 = (long *)*puVar6;
  }
  local_188 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_1e0 = *puVar9;
    lStack_1d8 = plVar5[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *puVar9;
    local_1f0 = (ulong *)*plVar5;
  }
  local_1e8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_230,(String *)((ulong)local_70 & 0xffffffff),(int)local_1e8);
  uVar11 = 0xf;
  if (local_1f0 != &local_1e0) {
    uVar11 = local_1e0;
  }
  if (uVar11 < local_230._M_string_length + local_1e8) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar12 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_230._M_string_length + local_1e8) goto LAB_0011fa44;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_1f0);
  }
  else {
LAB_0011fa44:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_230._M_dataplus._M_p);
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffff80;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_80 = *plVar5;
    uStack_78 = puVar6[3];
  }
  else {
    local_80 = *plVar5;
    kIndent.field_2._8_8_ = (long *)*puVar6;
  }
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append(kIndent.field_2._M_local_buf + 8);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  puVar9 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_210.field_2._M_allocated_capacity = *puVar9;
    local_210.field_2._8_8_ = plVar5[3];
  }
  else {
    local_210.field_2._M_allocated_capacity = *puVar9;
    local_210._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_210._M_string_length = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff80) {
    operator_delete((void *)kIndent.field_2._8_8_,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
LAB_0011fcfa:
  OutputJsonKey(stream,(string *)local_d0,&local_2d0,&local_210,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  local_70 = (undefined1  [8])piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"time","");
  FormatTimeInMillisAsDuration_abi_cxx11_
            ((string *)((long)&kIndent.field_2 + 8),
             *(internal **)(*(long *)(time_struct.tm_zone + 0x40) + 0x1c8),ms);
  OutputJsonKey(stream,(string *)local_d0,(string *)local_70,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuites.field_2 + 8),false);
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff80) {
    operator_delete((void *)kIndent.field_2._8_8_,local_80 + 1);
  }
  if (local_70 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_70,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  TestPropertiesAsJson
            ((string *)local_70,(TestResult *)(*(long *)(time_struct.tm_zone + 0x40) + 0x118),
             (string *)((long)&kTestsuites.field_2 + 8));
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_70,CONCAT44(time_struct.tm_min,time_struct.tm_sec));
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\n",2);
  if (local_70 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_70,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  local_70 = (undefined1  [8])piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"name","");
  kIndent.field_2._8_8_ = &stack0xffffffffffffff80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kIndent.field_2 + 8),"AllTests","");
  OutputJsonKey(stream,(string *)local_d0,(string *)local_70,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff80) {
    operator_delete((void *)kIndent.field_2._8_8_,local_80 + 1);
  }
  if (local_70 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_70,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)kTestsuites.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)local_d0,(long)kTestsuites._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\": [\n",5);
  lVar8 = *(long *)(*(long *)(time_struct.tm_zone + 0x40) + 0xb8);
  if (0 < (int)((ulong)(*(long *)(*(long *)(time_struct.tm_zone + 0x40) + 0xc0) - lVar8) >> 3)) {
    lVar14 = 0;
    bVar10 = false;
    do {
      lVar8 = *(long *)(lVar8 + lVar14 * 8);
      plVar5 = *(long **)(lVar8 + 0x30);
      plVar2 = *(long **)(lVar8 + 0x38);
      if (plVar5 != plVar2) {
        iVar3 = 0;
        do {
          uVar13 = *(byte *)(*plVar5 + 0x83) ^ 1;
          if (*(char *)(*plVar5 + 0x82) == '\0') {
            uVar13 = 0;
          }
          iVar3 = iVar3 + uVar13;
          plVar5 = plVar5 + 1;
        } while (plVar5 != plVar2);
        if (iVar3 != 0) {
          bVar15 = true;
          if (bVar10) {
            std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
            bVar15 = bVar10;
          }
          PrintJsonTestCase(stream,*(TestCase **)
                                    (*(long *)(*(long *)(time_struct.tm_zone + 0x40) + 0xb8) +
                                    lVar14 * 8));
          bVar10 = bVar15;
        }
      }
      lVar14 = lVar14 + 1;
      lVar8 = *(long *)(*(long *)(time_struct.tm_zone + 0x40) + 0xb8);
    } while (lVar14 < (int)((ulong)(*(long *)(*(long *)(time_struct.tm_zone + 0x40) + 0xc0) - lVar8)
                           >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)kTestsuites.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
  if ((size_type *)kTestsuites.field_2._8_8_ != &kIndent._M_string_length) {
    operator_delete((void *)kTestsuites.field_2._8_8_,kIndent._M_string_length + 1);
  }
  if (local_d0 != (undefined1  [8])&kTestsuites._M_string_length) {
    operator_delete((void *)local_d0,kTestsuites._M_string_length + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestCase(stream, *unit_test.GetTestCase(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}